

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbsdf.c
# Opt level: O0

FT_Error bsdf_raster_render(FT_Raster raster,FT_Raster_Params *params)

{
  FT_Bitmap *source_00;
  FT_Bitmap *target_00;
  SDF_Raster_Params *sdf_params;
  BSDF_Worker worker;
  BSDF_TRaster *bsdf_raster;
  FT_Bitmap *target;
  FT_Bitmap *source;
  FT_Memory memory;
  FT_Raster_Params *pFStack_18;
  FT_Error error;
  FT_Raster_Params *params_local;
  FT_Raster raster_local;
  
  memory._4_4_ = 0;
  source = (FT_Bitmap *)0x0;
  sdf_params = (SDF_Raster_Params *)0x0;
  worker.params._96_8_ = raster;
  pFStack_18 = params;
  params_local = (FT_Raster_Params *)raster;
  if ((raster == (FT_Raster)0x0) || (params == (FT_Raster_Params *)0x0)) {
    memory._4_4_ = 6;
  }
  else if (params->flags == 8) {
    source_00 = (FT_Bitmap *)params->source;
    target_00 = params->target;
    if ((source_00 == (FT_Bitmap *)0x0) || (target_00 == (FT_Bitmap *)0x0)) {
      memory._4_4_ = 6;
    }
    else {
      source = *(FT_Bitmap **)raster;
      if (source == (FT_Bitmap *)0x0) {
        memory._4_4_ = 0x20;
      }
      else if ((*(uint *)&params[1].target < 0x21) && (1 < *(uint *)&params[1].target)) {
        sdf_params = (SDF_Raster_Params *)
                     ft_mem_qrealloc((FT_Memory)source,(ulong)target_00->width << 5,0,
                                     (ulong)target_00->rows,(void *)0x0,
                                     (FT_Error *)((long)&memory + 4));
        if (memory._4_4_ == 0) {
          worker.distance_map._0_4_ = target_00->width;
          worker.distance_map._4_4_ = target_00->rows;
          memcpy(&worker.width,params,0x68);
          memory._4_4_ = bsdf_init_distance_map(source_00,(BSDF_Worker *)&sdf_params);
          if (((memory._4_4_ == 0) &&
              (memory._4_4_ = bsdf_approximate_edge((BSDF_Worker *)&sdf_params), memory._4_4_ == 0))
             && (memory._4_4_ = edt8((BSDF_Worker *)&sdf_params), memory._4_4_ == 0)) {
            memory._4_4_ = finalize_sdf((BSDF_Worker *)&sdf_params,target_00);
          }
        }
      }
      else {
        memory._4_4_ = 6;
      }
    }
  }
  else {
    memory._4_4_ = 0x61;
  }
  if (sdf_params != (SDF_Raster_Params *)0x0) {
    ft_mem_free((FT_Memory)source,sdf_params);
  }
  return memory._4_4_;
}

Assistant:

static FT_Error
  bsdf_raster_render( FT_Raster                raster,
                      const FT_Raster_Params*  params )
  {
    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = NULL;

    const FT_Bitmap*  source = NULL;
    const FT_Bitmap*  target = NULL;

    BSDF_TRaster*  bsdf_raster = (BSDF_TRaster*)raster;
    BSDF_Worker    worker;

    const SDF_Raster_Params*  sdf_params = (const SDF_Raster_Params*)params;


    worker.distance_map = NULL;

    /* check for valid parameters */
    if ( !raster || !params )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* check whether the flag is set */
    if ( sdf_params->root.flags != FT_RASTER_FLAG_SDF )
    {
      error = FT_THROW( Raster_Corrupted );
      goto Exit;
    }

    source = (const FT_Bitmap*)sdf_params->root.source;
    target = (const FT_Bitmap*)sdf_params->root.target;

    /* check source and target bitmap */
    if ( !source || !target )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    memory = bsdf_raster->memory;
    if ( !memory )
    {
      FT_TRACE0(( "bsdf_raster_render: Raster not set up properly,\n" ));
      FT_TRACE0(( "                    unable to find memory handle.\n" ));

      error = FT_THROW( Invalid_Handle );
      goto Exit;
    }

    /* check whether spread is set properly */
    if ( sdf_params->spread > MAX_SPREAD ||
         sdf_params->spread < MIN_SPREAD )
    {
      FT_TRACE0(( "bsdf_raster_render:"
                  " The `spread' field of `SDF_Raster_Params'\n" ));
      FT_TRACE0(( "                   "
                  " is invalid; the value of this field must be\n" ));
      FT_TRACE0(( "                   "
                  " within [%d, %d].\n",
                  MIN_SPREAD, MAX_SPREAD ));
      FT_TRACE0(( "                   "
                  " Also, you must pass `SDF_Raster_Params'\n" ));
      FT_TRACE0(( "                   "
                  " instead of the default `FT_Raster_Params'\n" ));
      FT_TRACE0(( "                   "
                  " while calling this function and set the fields\n" ));
      FT_TRACE0(( "                   "
                  " accordingly.\n" ));

      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* set up the worker */

    /* allocate the distance map */
    if ( FT_QALLOC_MULT( worker.distance_map, target->rows,
                         target->width * sizeof ( *worker.distance_map ) ) )
      goto Exit;

    worker.width  = (int)target->width;
    worker.rows   = (int)target->rows;
    worker.params = *sdf_params;

    FT_CALL( bsdf_init_distance_map( source, &worker ) );
    FT_CALL( bsdf_approximate_edge( &worker ) );
    FT_CALL( edt8( &worker ) );
    FT_CALL( finalize_sdf( &worker, target ) );

    FT_TRACE0(( "bsdf_raster_render: Total memory used = %ld\n",
                worker.width * worker.rows *
                  (long)sizeof ( *worker.distance_map ) ));

  Exit:
    if ( worker.distance_map )
      FT_FREE( worker.distance_map );

    return error;
  }